

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  char *pcVar1;
  StringPiece *local_40;
  char *result;
  size_type pos_local;
  StringPiece *pSStack_18;
  char c_local;
  StringPiece *this_local;
  
  if ((this->length_ < 1) || ((ulong)(long)this->length_ <= pos)) {
    this_local = (StringPiece *)0xffffffffffffffff;
  }
  else {
    pos_local._7_1_ = c;
    pSStack_18 = this;
    pcVar1 = std::find<char_const*,char>
                       (this->ptr_ + pos,this->ptr_ + this->length_,(char *)((long)&pos_local + 7));
    if (pcVar1 == this->ptr_ + this->length_) {
      local_40 = (StringPiece *)0xffffffffffffffff;
    }
    else {
      local_40 = (StringPiece *)(pcVar1 + -(long)this->ptr_);
    }
    this_local = local_40;
  }
  return (size_type)this_local;
}

Assistant:

StringPiece::size_type StringPiece::find(char c, size_type pos) const {
  if (length_ <= 0 || pos >= static_cast<size_type>(length_)) {
    return npos;
  }
  const char* result = std::find(ptr_ + pos, ptr_ + length_, c);
  return result != ptr_ + length_ ? result - ptr_ : npos;
}